

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall
ParserTestDuplicateRuleInDifferentSubninjas::Run(ParserTestDuplicateRuleInDifferentSubninjas *this)

{
  VirtualFileSystem *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *this_01;
  bool condition;
  string err;
  ManifestParser parser;
  string local_c0;
  string local_a0;
  undefined1 local_80 [96];
  
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"test.ninja","");
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"rule cat\n  command = cat\n","");
  this_00 = &(this->super_ParserTest).fs_;
  VirtualFileSystem::Create(this_00,(string *)local_80,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  ManifestParser::ManifestParser
            ((ManifestParser *)local_80,&(this->super_ParserTest).state,(FileReader *)this_00,
             (ManifestParserOptions)0x0);
  this_01 = g_current_test;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"rule cat\n  command = cat\nsubninja test.ninja\n","");
  condition = ManifestParser::ParseTest((ManifestParser *)local_80,&local_a0,&local_c0);
  testing::Test::Check
            (this_01,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x390,
             "parser.ParseTest(\"rule cat\\n\" \"  command = cat\\n\" \"subninja test.ninja\\n\", &err)"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateRuleInDifferentSubninjas) {
  // Test that rules are scoped to subninjas.
  fs_.Create("test.ninja", "rule cat\n"
                         "  command = cat\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_TRUE(parser.ParseTest("rule cat\n"
                                "  command = cat\n"
                                "subninja test.ninja\n", &err));
}